

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimization-options.h
# Opt level: O2

void __thiscall wasm::OptimizationOptions::parse(OptimizationOptions *this,int argc,char **argv)

{
  undefined4 in_register_00000034;
  
  wasm::Options::parse((int)this + 8,(char **)CONCAT44(in_register_00000034,argc));
  if ((this->allowStackIR == true) &&
     ((1 < (this->super_ToolOptions).passOptions.optimizeLevel ||
      (0 < (this->super_ToolOptions).passOptions.shrinkLevel)))) {
    (this->super_ToolOptions).passOptions.generateStackIR = true;
    (this->super_ToolOptions).passOptions.optimizeStackIR = true;
  }
  return;
}

Assistant:

void parse(int argc, const char* argv[]) {
    ToolOptions::parse(argc, argv);

    // After parsing the arguments, update defaults based on the optimize/shrink
    // levels.
    if (allowStackIR &&
        (passOptions.optimizeLevel >= 2 || passOptions.shrinkLevel >= 1)) {
      passOptions.generateStackIR = true;
      passOptions.optimizeStackIR = true;
    }
  }